

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::RemoveSegment(ON_Linetype *this,int index)

{
  bool bVar1;
  int iVar2;
  bool rc;
  int index_local;
  ON_Linetype *this_local;
  
  bVar1 = PatternIsLocked(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
    if (-1 < index) {
      iVar2 = ON_SimpleArray<ON_LinetypeSegment>::Count(&this->m_private->m_segments);
      this_local._7_1_ = index < iVar2;
    }
    if (this_local._7_1_) {
      ON_SimpleArray<ON_LinetypeSegment>::Remove(&this->m_private->m_segments,index);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Linetype::RemoveSegment( int index )
{
  if (PatternIsLocked())
    return false;
  bool rc = ( index >= 0 && index < m_private->m_segments.Count());
  if (rc)
    m_private->m_segments.Remove(index);
  return rc;
}